

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_ModifyMonitoredItems
               (UA_Server *server,UA_Session *session,UA_ModifyMonitoredItemsRequest *request,
               UA_ModifyMonitoredItemsResponse *response)

{
  UA_Subscription *sub_00;
  UA_MonitoredItemModifyResult *pUVar1;
  uint local_78;
  uint local_70;
  uint local_6c;
  ulong local_60;
  size_t i;
  UA_Subscription *sub;
  UA_ModifyMonitoredItemsResponse *response_local;
  UA_ModifyMonitoredItemsRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = session->channel->connection->sockfd;
    }
    local_70 = local_6c;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing ModifyMonitoredItemsRequest"
               ,(ulong)local_70,(ulong)local_78,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  if (request->timestampsToReturn < 4) {
    sub_00 = UA_Session_getSubscriptionByID(session,request->subscriptionId);
    if (sub_00 == (UA_Subscription *)0x0) {
      (response->responseHeader).serviceResult = 0x80280000;
    }
    else {
      sub_00->currentLifetimeCount = 0;
      if (request->itemsToModifySize == 0) {
        (response->responseHeader).serviceResult = 0x800f0000;
      }
      else {
        pUVar1 = (UA_MonitoredItemModifyResult *)
                 UA_Array_new(request->itemsToModifySize,UA_TYPES + 0x1e);
        response->results = pUVar1;
        if (response->results == (UA_MonitoredItemModifyResult *)0x0) {
          (response->responseHeader).serviceResult = 0x80030000;
        }
        else {
          response->resultsSize = request->itemsToModifySize;
          for (local_60 = 0; local_60 < request->itemsToModifySize; local_60 = local_60 + 1) {
            Service_ModifyMonitoredItems_single
                      (server,session,sub_00,request->itemsToModify + local_60,
                       response->results + local_60);
          }
        }
      }
    }
  }
  else {
    (response->responseHeader).serviceResult = 0x802b0000;
  }
  return;
}

Assistant:

void Service_ModifyMonitoredItems(UA_Server *server, UA_Session *session,
                                  const UA_ModifyMonitoredItemsRequest *request,
                                  UA_ModifyMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing ModifyMonitoredItemsRequest");

    /* check if the timestampstoreturn is valid */
    if(request->timestampsToReturn > UA_TIMESTAMPSTORETURN_NEITHER) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADTIMESTAMPSTORETURNINVALID;
        return;
    }

    /* Get the subscription */
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    if(request->itemsToModifySize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->itemsToModifySize,
                                     &UA_TYPES[UA_TYPES_MONITOREDITEMMODIFYRESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->itemsToModifySize;

    for(size_t i = 0; i < request->itemsToModifySize; ++i)
        Service_ModifyMonitoredItems_single(server, session, sub, &request->itemsToModify[i],
                                            &response->results[i]);

}